

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O0

bool __thiscall efsw::FileInfo::operator==(FileInfo *this,FileInfo *Other)

{
  bool local_19;
  FileInfo *Other_local;
  FileInfo *this_local;
  
  local_19 = false;
  if ((((this->ModificationTime == Other->ModificationTime) &&
       (local_19 = false, this->Size == Other->Size)) &&
      (local_19 = false, this->OwnerId == Other->OwnerId)) &&
     ((local_19 = false, this->GroupId == Other->GroupId &&
      (local_19 = false, this->Permissions == Other->Permissions)))) {
    local_19 = this->Inode == Other->Inode;
  }
  return local_19;
}

Assistant:

bool FileInfo::operator==( const FileInfo& Other ) const
{
	return (	ModificationTime	== Other.ModificationTime &&
				Size				== Other.Size &&
				OwnerId				== Other.OwnerId &&
				GroupId				== Other.GroupId &&
				Permissions			== Other.Permissions &&
				Inode				== Other.Inode
	);
}